

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSlowShrinking.cpp
# Opt level: O1

bool __thiscall
PropTestSlowFunction::check(PropTestSlowFunction *this,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  timespec local_28;
  
  if (((this->shrinking)._M_base._M_i & 1U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sleeping...",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    local_28.tv_sec = 1;
    local_28.tv_nsec = 0;
    do {
      iVar3 = nanosleep(&local_28,&local_28);
      if (iVar3 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  }
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  bVar2 = true;
  if ((0xc < (ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar1)) &&
     (piVar1[3] % 5 == 1)) {
    LOCK();
    (this->shrinking)._M_base._M_i = true;
    UNLOCK();
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool check(const std::vector<int>& v) const override {
    if (shrinking) {
      std::cout << "Sleeping..." << std::endl;
      std::this_thread::sleep_for(std::chrono::seconds(1));
    }

    if (v.size() >= 4 && (v[3] % 5) == 1) {
      shrinking = true;
      return false;
    }
    return true;
  }